

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O1

void __thiscall icu_63::Package::addFile(Package *this,char *filesPath,char *name)

{
  undefined8 in_RAX;
  uint8_t *data;
  char type;
  int32_t length;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  data = readFile(filesPath,name,(int32_t *)((long)&uStack_28 + 4),(char *)((long)&uStack_28 + 3));
  addItem(this,name,data,uStack_28._4_4_,'\x01',uStack_28._3_1_);
  return;
}

Assistant:

void
Package::addFile(const char *filesPath, const char *name) {
    uint8_t *data;
    int32_t length;
    char type;

    data=readFile(filesPath, name, length, type);
    // readFile() exits the tool if it fails
    addItem(name, data, length, TRUE, type);
}